

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QItemViewPaintPairs * __thiscall
QTreeViewPrivate::draggablePaintPairs
          (QItemViewPaintPairs *__return_storage_ptr__,QTreeViewPrivate *this,
          QModelIndexList *indexes,QRect *r)

{
  int row;
  Data *pDVar1;
  QTreeView *this_00;
  bool bVar2;
  QModelIndex *idx;
  QModelIndex *this_01;
  long lVar3;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->spanningIndexes).q_hash.d;
  if ((pDVar1 == (Data *)0x0) || (pDVar1->size == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00542273;
    QAbstractItemViewPrivate::draggablePaintPairs
              (__return_storage_ptr__,&this->super_QAbstractItemViewPrivate,indexes,r);
  }
  else {
    this_00 = *(QTreeView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QModelIndex *)0x0;
    local_58.size = 0;
    this_01 = (indexes->d).ptr;
    for (lVar3 = (indexes->d).size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      if (this_01->c < 1) {
LAB_005421fc:
        QList<QModelIndex>::emplaceBack<QModelIndex_const&>((QList<QModelIndex> *)&local_58,this_01)
        ;
      }
      else {
        row = this_01->r;
        QModelIndex::parent(&local_70,this_01);
        bVar2 = QTreeView::isFirstColumnSpanned(this_00,row,&local_70);
        if (!bVar2) goto LAB_005421fc;
      }
      this_01 = this_01 + 1;
    }
    QAbstractItemViewPrivate::draggablePaintPairs
              (__return_storage_ptr__,&this->super_QAbstractItemViewPrivate,
               (QModelIndexList *)&local_58,r);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00542273:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QItemViewPaintPairs QTreeViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QTreeView);
    if (spanningIndexes.isEmpty())
        return QAbstractItemViewPrivate::draggablePaintPairs(indexes, r);
    QModelIndexList list;
    for (const QModelIndex &idx : indexes) {
        if (idx.column() > 0 && q->isFirstColumnSpanned(idx.row(), idx.parent()))
            continue;
        list << idx;
    }
    return QAbstractItemViewPrivate::draggablePaintPairs(list, r);
}